

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer *
SerializePointer<line_t>
          (FSerializer *arc,char *key,line_t_conflict **value,line_t_conflict **defval,
          line_t_conflict *base)

{
  uint uVar1;
  line_t_conflict *plVar2;
  int64_t vv;
  long local_30;
  
  if (base == (line_t_conflict *)0x0) {
    __assert_fail("base != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                  ,0x59f,
                  "FSerializer &SerializePointer(FSerializer &, const char *, T *&, T **, T *) [T = line_t]"
                 );
  }
  if (arc->r == (FReader *)0x0) {
    uVar1 = (arc->w->mInObject).Count;
    if (((uVar1 != 0) && (defval != (line_t_conflict **)0x0)) &&
       ((arc->w->mInObject).Array[uVar1 - 1] != false)) {
      plVar2 = *value;
      if (plVar2 == *defval) {
        return arc;
      }
      goto LAB_0047b20a;
    }
  }
  plVar2 = *value;
LAB_0047b20a:
  if (plVar2 == (line_t_conflict *)0x0) {
    local_30 = -1;
  }
  else {
    local_30 = ((long)plVar2 - (long)base >> 3) * -0x79435e50d79435e5;
  }
  Serialize(arc,key,&local_30,(int64_t *)0x0);
  plVar2 = base + local_30;
  if (local_30 < 0) {
    plVar2 = (line_t_conflict *)0x0;
  }
  *value = plVar2;
  return arc;
}

Assistant:

FSerializer &SerializePointer(FSerializer &arc, const char *key, T *&value, T **defval, T *base)
{
	assert(base != nullptr);
	if (arc.isReading() || !arc.w->inObject() || defval == nullptr || value != *defval)
	{
		int64_t vv = value == nullptr ? -1 : value - base;
		Serialize(arc, key, vv, nullptr);
		value = vv < 0 ? nullptr : base + vv;
	}
	return arc;
}